

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void point_mul(uchar *outx,uchar *outy,uchar *scalar,uchar *inx,uchar *iny)

{
  pt_aff_t_conflict3 P;
  uint64_t *in_stack_00000218;
  uint8_t *in_stack_00000220;
  uint8_t *in_stack_00000290;
  uint64_t *in_stack_00000298;
  uint64_t *in_stack_00000498;
  uint64_t *in_stack_000004a0;
  uint64_t *in_stack_00000508;
  uint64_t *in_stack_00000510;
  pt_aff_t_conflict3 *in_stack_00000d50;
  uchar *in_stack_00000d58;
  pt_aff_t_conflict3 *in_stack_00000d60;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(in_stack_00000298,in_stack_00000290);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(in_stack_00000298,in_stack_00000290);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(in_stack_00000510,in_stack_00000508);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(in_stack_00000510,in_stack_00000508);
  var_smul_rwnaf(in_stack_00000d60,in_stack_00000d58,in_stack_00000d50);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(in_stack_000004a0,in_stack_00000498);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(in_stack_000004a0,in_stack_00000498);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(in_stack_00000220,in_stack_00000218);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(in_stack_00000220,in_stack_00000218);
  return;
}

Assistant:

static void point_mul(unsigned char outx[64], unsigned char outy[64],
                      const unsigned char scalar[64],
                      const unsigned char inx[64],
                      const unsigned char iny[64]) {
    pt_aff_t P;

    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(P.X, inx);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(P.Y, iny);
    /* var scmul function */
    var_smul_rwnaf(&P, scalar, &P);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(outx, P.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(outy, P.Y);
}